

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O1

int __thiscall FastPForLib::ZipfianGenerator::nextInt(ZipfianGenerator *this)

{
  pointer pdVar1;
  uint uVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  
  auVar6 = in_ZMM0._0_16_;
  uVar2 = ZRandom::getValue(&this->rand);
  pdVar1 = (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  pdVar3 = pdVar1;
  if (0 < (long)uVar5) {
    auVar6 = vcvtusi2sd_avx512f(auVar6,uVar2);
    do {
      uVar4 = uVar5 >> 1;
      if (pdVar3[uVar4] < auVar6._0_8_ * 2.3283064365386963e-10) {
        pdVar3 = pdVar3 + uVar4 + 1;
        uVar4 = ~uVar4 + uVar5;
      }
      uVar5 = uVar4;
    } while (0 < (long)uVar4);
  }
  return (int)((ulong)((long)pdVar3 - (long)pdVar1) >> 3);
}

Assistant:

int nextInt() {
    // Map z to the value
    const double u = rand.getDouble();
    return static_cast<int>(lower_bound(proba.begin(), proba.end(), u) -
                            proba.begin());
  }